

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O0

void small_alloc_create(small_alloc *alloc,slab_cache *cache,uint32_t objsize_min,uint granularity,
                       float alloc_factor,float *actual_alloc_factor)

{
  uint32_t uVar1;
  size_t sVar2;
  intptr_t iVar3;
  size_t sVar4;
  float *actual_alloc_factor_local;
  float alloc_factor_local;
  uint granularity_local;
  uint32_t objsize_min_local;
  slab_cache *cache_local;
  small_alloc *alloc_local;
  
  alloc->cache = cache;
  sVar2 = small_align((ulong)objsize_min,(ulong)granularity);
  iVar3 = slab_order_size(cache,cache->order_max);
  uVar1 = mempool_objsize_max((uint32_t)iVar3);
  alloc->objsize_max = uVar1;
  sVar4 = small_align((ulong)alloc->objsize_max,(ulong)granularity);
  alloc->objsize_max = (uint32_t)sVar4;
  if ((granularity & granularity - 1) != 0) {
    __assert_fail("(granularity & (granularity - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                  ,0x134,
                  "void small_alloc_create(struct small_alloc *, struct slab_cache *, uint32_t, unsigned int, float, float *)"
                 );
  }
  if ((1.0 < alloc_factor) && (alloc_factor <= 2.0)) {
    alloc->factor = alloc_factor;
    small_class_create(&alloc->small_class,granularity,alloc->factor,(uint)sVar2,actual_alloc_factor
                      );
    small_mempool_create(alloc);
    return;
  }
  __assert_fail("alloc_factor > 1. && alloc_factor <= 2.",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c",
                0x135,
                "void small_alloc_create(struct small_alloc *, struct slab_cache *, uint32_t, unsigned int, float, float *)"
               );
}

Assistant:

void
small_alloc_create(struct small_alloc *alloc, struct slab_cache *cache,
		   uint32_t objsize_min, unsigned granularity,
		   float alloc_factor, float *actual_alloc_factor)
{
	alloc->cache = cache;
	/* Align sizes. */
	objsize_min = small_align(objsize_min, granularity);
	/* Make sure at least 4 largest objects can fit in a slab. */
	alloc->objsize_max =
		mempool_objsize_max(slab_order_size(cache, cache->order_max));
	alloc->objsize_max = small_align(alloc->objsize_max, granularity);

	assert((granularity & (granularity - 1)) == 0);
	assert(alloc_factor > 1. && alloc_factor <= 2.);

	alloc->factor = alloc_factor;
	/*
	 * Second parameter granularity, determines alignment.
	 */
	small_class_create(&alloc->small_class, granularity,
			   alloc->factor, objsize_min, actual_alloc_factor);
	small_mempool_create(alloc);
}